

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_node __thiscall pugi::xpath_query::evaluate_node(xpath_query *this,xpath_node *n)

{
  xpath_ast_node *pxVar1;
  xpath_ast_node *this_00;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_node local_20d8;
  xpath_node_set_raw local_20c8;
  xpath_context local_20a8;
  xpath_memory_block local_2080;
  xpath_memory_block local_1070;
  xpath_allocator local_60;
  xpath_allocator local_48;
  xpath_stack local_30;
  bool local_20 [8];
  
  if ((long *)this->_impl == (long *)0x0) {
    this_00 = (xpath_ast_node *)0x0;
  }
  else {
    pxVar1 = *this->_impl;
    this_00 = (xpath_ast_node *)0x0;
    if (pxVar1->_rettype == '\x01') {
      this_00 = pxVar1;
    }
  }
  if (this_00 == (xpath_ast_node *)0x0) {
    xpath_node::xpath_node(&local_20d8);
  }
  else {
    local_20a8.n._node._root = (n->_node)._root;
    local_20a8.n._attribute._attr = (n->_attribute)._attr;
    local_20a8.position = 1;
    local_20a8.size = 1;
    local_60._error = local_20;
    local_60._root = &local_2080;
    local_60._root_size = 0;
    local_48._root = &local_1070;
    local_48._root_size = 0;
    local_20[0] = false;
    local_1070.next = (xpath_memory_block *)0x0;
    local_2080.next = (xpath_memory_block *)0x0;
    local_1070.capacity = 0x1000;
    local_2080.capacity = 0x1000;
    local_48._error = local_60._error;
    local_30.result = &local_60;
    local_30.temp = &local_48;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (&local_20c8,this_00,&local_20a8,&local_30,nodeset_eval_first);
    if (local_20[0] == true) {
      xpath_node::xpath_node(&local_20d8);
    }
    else {
      local_20d8 = impl::anon_unknown_0::xpath_first
                             (local_20c8._begin,local_20c8._end,local_20c8._type);
    }
    impl::anon_unknown_0::xpath_allocator::release(&local_60);
    impl::anon_unknown_0::xpath_allocator::release(&local_48);
  }
  return local_20d8;
}

Assistant:

PUGI_IMPL_FN xpath_node xpath_query::evaluate_node(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_first);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r.first();
	}